

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Catch::ExpressionResultBuilder::reconstructExpression_abi_cxx11_
          (ExpressionResultBuilder *this,AssertionInfo *info)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  long local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  bVar1 = std::operator==(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    else {
      std::__cxx11::string::string(in_RDI,(string *)(local_18 + 0x48));
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_RDI);
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_38);
    }
    else {
      bVar1 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (bVar1) {
        lVar3 = std::__cxx11::string::size();
        lVar4 = std::__cxx11::string::size();
        if ((((ulong)(lVar3 + lVar4) < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0x50),0x1cc6db), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0x70),0x1cc6db), lVar3 == -1)) {
          pbVar5 = local_a8;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         (char *)in_RDI);
          std::operator+(pbVar5,in_stack_fffffffffffffdc0);
          std::operator+(pbVar5,(char *)in_stack_fffffffffffffdc0);
          std::operator+(pbVar5,in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_68);
          std::__cxx11::string::~string(local_88);
          std::__cxx11::string::~string((string *)local_a8);
        }
        else {
          pbVar5 = local_108;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         (char *)in_RDI);
          std::operator+(in_stack_fffffffffffffdc8,pbVar5);
          std::operator+(in_stack_fffffffffffffdc8,(char *)pbVar5);
          std::operator+(in_stack_fffffffffffffdc8,pbVar5);
          std::__cxx11::string::~string(local_c8);
          std::__cxx11::string::~string(local_e8);
          std::__cxx11::string::~string((string *)local_108);
        }
      }
      else {
        std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdf8,local_18 + 0x48);
        std::operator+(in_stack_fffffffffffffdf8,in_RSI);
        std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
        std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
        std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string(local_1e8);
      }
    }
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs;
}

Assistant:

std::string ExpressionResultBuilder::reconstructExpression( AssertionInfo const& info ) const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? info.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + info.macroName + "_FALSE( " + info.capturedExpression.substr(1) + " ) instead of " + info.macroName + "( " + info.capturedExpression + " ) for better diagnostics}";
    }